

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O0

void mk_http_session_remove(mk_http_session *cs,mk_server *server)

{
  _func_int_mk_server_ptr *p_Var1;
  mk_list *__mptr;
  mk_http_request *sr;
  mk_plugin *handler;
  mk_list *head;
  mk_list *tmp;
  mk_server *server_local;
  mk_http_session *cs_local;
  
  if (cs->_sched_init != 0) {
    handler = (mk_plugin *)(cs->request_list).next;
    head = (mk_list *)handler->shortname;
    while (handler != (mk_plugin *)&cs->request_list) {
      if (handler[-1].master_init != (_func_int_mk_server_ptr *)0x0) {
        p_Var1 = handler[-1].master_init;
        if (*(long *)(*(long *)(p_Var1 + 0x58) + 0x20) == 0) {
          mk_print(0x1002,"Plugin %s, do not implement stage30_hangup",
                   *(undefined8 *)(p_Var1 + 0x10));
        }
        else {
          (**(code **)(*(long *)(p_Var1 + 0x58) + 0x20))(p_Var1,cs,&handler[-6].shortname);
        }
      }
      handler = (mk_plugin *)head;
      head = head->next;
    }
    if (cs->body != cs->body_fixed) {
      mk_mem_free(cs->body);
    }
    mk_http_request_free_list(cs,server);
    mk_list_del(&cs->request_list);
    cs->_sched_init = 0;
  }
  return;
}

Assistant:

void mk_http_session_remove(struct mk_http_session *cs,
                            struct mk_server *server)
{
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_plugin *handler;
    struct mk_http_request *sr;

    MK_TRACE("[FD %i] HTTP Session remove", cs->socket);
    if (cs->_sched_init == MK_FALSE) {
        return;
    }

    /* On session remove, make sure to cleanup any handler */
    mk_list_foreach_safe(head, tmp, &cs->request_list) {
        sr = mk_list_entry(head, struct mk_http_request, _head);
        if (sr->stage30_handler) {
            MK_TRACE("Hangup stage30 handler");
            handler = sr->stage30_handler;
            if (mk_unlikely(!handler->stage->stage30_hangup)) {
                mk_warn("Plugin %s, do not implement stage30_hangup", handler->name);
                continue;
            }
            handler->stage->stage30_hangup(handler, cs, sr);
        }
    }

    if (cs->body != cs->body_fixed) {
        mk_mem_free(cs->body);
    }
    mk_http_request_free_list(cs, server);
    mk_list_del(&cs->request_list);

    cs->_sched_init = MK_FALSE;
}